

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O0

void __thiscall
swrenderer::WallSampler::WallSampler
          (WallSampler *this,int y1,float swal,double yrepeat,fixed_t xoffset,FTexture *texture,
          _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  uint32_t uVar1;
  int n;
  BYTE *pBVar2;
  double __x;
  double dVar3;
  double v;
  double uv_stepd;
  int uv_fracbits;
  _func_BYTE_ptr_FTexture_ptr_int *getcol_local;
  FTexture *texture_local;
  fixed_t xoffset_local;
  double yrepeat_local;
  float swal_local;
  int y1_local;
  WallSampler *this_local;
  
  uVar1 = FTexture::GetHeight(texture);
  this->height = uVar1;
  n = 0x20 - (uint)texture->HeightBits;
  if (n == 0x20) {
    this->uv_pos = 0;
    this->uv_step = 0;
    this->uv_max = 1;
  }
  else {
    uv_stepd._4_1_ = (byte)n;
    this->uv_max = this->height << (uv_stepd._4_1_ & 0x1f);
    __x = (dc_texturemid + (double)swal * yrepeat * (((double)y1 - CenterY) + 0.5)) /
          (double)this->height;
    dVar3 = floor(__x);
    this->uv_pos = (uint32_t)
                   (long)((__x - dVar3) * (double)this->height *
                         (double)(1 << (uv_stepd._4_1_ & 0x1f)));
    uVar1 = xs_ToFixed(n,(real64)((double)swal * yrepeat));
    this->uv_step = uVar1;
    if (this->uv_step == 0) {
      this->uv_step = 1;
    }
  }
  pBVar2 = (*getcol)(texture,xoffset >> 0x10);
  this->source = pBVar2;
  return;
}

Assistant:

WallSampler::WallSampler(int y1, float swal, double yrepeat, fixed_t xoffset, FTexture *texture, const BYTE*(*getcol)(FTexture *texture, int x))
{
	height = texture->GetHeight();

	int uv_fracbits = 32 - texture->HeightBits;
	if (uv_fracbits != 32)
	{
		uv_max = height << uv_fracbits;

		// Find start uv in [0-base_height[ range.
		// Not using xs_ToFixed because it rounds the result and we need something that always rounds down to stay within the range.
		double uv_stepd = swal * yrepeat;
		double v = (dc_texturemid + uv_stepd * (y1 - CenterY + 0.5)) / height;
		v = v - floor(v);
		v *= height;
		v *= (1 << uv_fracbits);

		uv_pos = (uint32_t)v;
		uv_step = xs_ToFixed(uv_fracbits, uv_stepd);
		if (uv_step == 0) // To prevent divide by zero elsewhere
			uv_step = 1;
	}
	else
	{ // Hack for one pixel tall textures
		uv_pos = 0;
		uv_step = 0;
		uv_max = 1;
	}

	source = getcol(texture, xoffset >> FRACBITS);
}